

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O0

vector<duckdb::LogicalType,_true> * duckdb::ArgMaxByTypes(void)

{
  vector<duckdb::LogicalType,_true> *in_RDI;
  vector<duckdb::LogicalType,_true> *types;
  allocator_type *in_stack_fffffffffffffe98;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffea0;
  initializer_list<duckdb::LogicalType> in_stack_fffffffffffffea8;
  LogicalType *local_130;
  LogicalType local_f8 [24];
  LogicalType local_e0 [24];
  LogicalType local_c8 [24];
  LogicalType local_b0 [24];
  LogicalType local_98 [24];
  LogicalType local_80 [24];
  LogicalType local_68 [24];
  LogicalType local_50 [24];
  LogicalType local_38 [24];
  LogicalType *local_20;
  undefined8 local_18;
  undefined1 local_9;
  
  local_9 = 0;
  duckdb::LogicalType::LogicalType(local_f8,INTEGER);
  duckdb::LogicalType::LogicalType(local_e0,BIGINT);
  duckdb::LogicalType::LogicalType(local_c8,HUGEINT);
  duckdb::LogicalType::LogicalType(local_b0,DOUBLE);
  duckdb::LogicalType::LogicalType(local_98,VARCHAR);
  duckdb::LogicalType::LogicalType(local_80,DATE);
  duckdb::LogicalType::LogicalType(local_68,TIMESTAMP);
  duckdb::LogicalType::LogicalType(local_50,TIMESTAMP_TZ);
  duckdb::LogicalType::LogicalType(local_38,BLOB);
  local_20 = local_f8;
  local_18 = 9;
  std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x83121a);
  vector<duckdb::LogicalType,_true>::vector
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffea8,in_stack_fffffffffffffe98);
  std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x831245);
  local_130 = (LogicalType *)&local_20;
  do {
    local_130 = local_130 + -0x18;
    duckdb::LogicalType::~LogicalType(local_130);
  } while (local_130 != local_f8);
  return in_RDI;
}

Assistant:

static const vector<LogicalType> ArgMaxByTypes() {
	vector<LogicalType> types = {LogicalType::INTEGER,   LogicalType::BIGINT,       LogicalType::HUGEINT,
	                             LogicalType::DOUBLE,    LogicalType::VARCHAR,      LogicalType::DATE,
	                             LogicalType::TIMESTAMP, LogicalType::TIMESTAMP_TZ, LogicalType::BLOB};
	return types;
}